

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdtarga.c
# Opt level: O1

void start_input_tga(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  int *piVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  byte bVar4;
  int iVar6;
  cd_progress_ptr progress;
  size_t sVar7;
  jpeg_error_mgr *pjVar8;
  jvirt_sarray_ptr pjVar9;
  code *pcVar10;
  JSAMPARRAY ppJVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  U_CHAR targaheader [18];
  byte local_58;
  byte local_57;
  byte local_56;
  short local_55;
  byte local_53;
  byte local_52;
  char local_51;
  ushort local_4c;
  ushort local_4a;
  undefined4 local_48;
  ulong local_38;
  uint uVar5;
  
  sVar7 = fread(&local_58,1,0x12,(FILE *)sinfo->input_file);
  if (sVar7 != 0x12) {
    pjVar8 = cinfo->err;
    pjVar8->msg_code = 0x2b;
    (*pjVar8->error_exit)((j_common_ptr)cinfo);
  }
  uVar18 = local_48;
  uVar5 = 0x10;
  if ((char)local_48 != '\x0f') {
    uVar5 = local_48;
  }
  bVar4 = (byte)uVar5;
  local_48 = CONCAT31(local_48._1_3_,bVar4);
  uVar3 = local_48;
  uVar14 = (uint)local_58;
  uVar16 = (uint)local_56;
  local_38 = (ulong)local_53;
  uVar12 = (uint)local_4c;
  uVar13 = (uint)local_4a;
  *(uint *)&sinfo[1].field_0x2c = (uint)(bVar4 >> 3);
  local_48._1_1_ = SUB41(uVar18,1);
  local_48 = uVar3;
  if (((((1 < local_57) || ((byte)(bVar4 - 0x28) < 0xe0)) || ((uVar5 & 7) != 0)) ||
      ((0x3f < local_48._1_1_ || (uVar12 == 0)))) || (uVar13 == 0)) {
    pjVar8 = cinfo->err;
    pjVar8->msg_code = 0x40d;
    (*pjVar8->error_exit)((j_common_ptr)cinfo);
  }
  if (local_56 < 9) {
    sinfo[1].buffer = (JSAMPARRAY)read_non_rle_pixel;
  }
  else {
    sinfo[1].buffer = (JSAMPARRAY)read_rle_pixel;
    *(undefined8 *)((long)&sinfo[2].start_input + 4) = 0;
    uVar16 = local_56 - 8;
  }
  cinfo->in_color_space = JCS_RGB;
  if (uVar16 == 3) {
    cinfo->in_color_space = JCS_GRAYSCALE;
    if (*(int *)&sinfo[1].field_0x2c == 1) {
      sinfo[2].finish_input = get_8bit_gray_row;
    }
    else {
      pjVar8 = cinfo->err;
      pjVar8->msg_code = 0x40d;
      (*pjVar8->error_exit)((j_common_ptr)cinfo);
    }
    pjVar8 = cinfo->err;
    pjVar8->msg_code = 0x410;
    (pjVar8->msg_parm).i[0] = uVar12;
    (cinfo->err->msg_parm).i[1] = uVar13;
    iVar17 = 1;
    (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
    goto LAB_00107820;
  }
  if (uVar16 == 2) {
    iVar17 = *(int *)&sinfo[1].field_0x2c;
    if ((iVar17 == 4) || (iVar17 == 3)) {
      pcVar10 = get_24bit_row;
LAB_00107781:
      sinfo[2].finish_input = pcVar10;
    }
    else {
      if (iVar17 == 2) {
        pcVar10 = get_16bit_row;
        goto LAB_00107781;
      }
      pjVar8 = cinfo->err;
      pjVar8->msg_code = 0x40d;
      (*pjVar8->error_exit)((j_common_ptr)cinfo);
    }
    pjVar8 = cinfo->err;
    pjVar8->msg_code = 0x40f;
LAB_001077fb:
    (pjVar8->msg_parm).i[0] = uVar12;
    (cinfo->err->msg_parm).i[1] = uVar13;
    (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
  }
  else {
    if (uVar16 == 1) {
      if (local_57 == 1 && *(int *)&sinfo[1].field_0x2c == 1) {
        sinfo[2].finish_input = get_8bit_row;
      }
      else {
        pjVar8 = cinfo->err;
        pjVar8->msg_code = 0x40d;
        (*pjVar8->error_exit)((j_common_ptr)cinfo);
      }
      pjVar8 = cinfo->err;
      pjVar8->msg_code = 0x411;
      goto LAB_001077fb;
    }
    pjVar8 = cinfo->err;
    pjVar8->msg_code = 0x40d;
    (*pjVar8->error_exit)((j_common_ptr)cinfo);
  }
  iVar17 = 3;
LAB_00107820:
  if ((uVar18 & 0x2000) == 0) {
    pjVar9 = (*cinfo->mem->request_virt_sarray)((j_common_ptr)cinfo,1,0,iVar17 * uVar12,uVar13,1);
    sinfo[1].finish_input = (_func_void_j_compress_ptr_cjpeg_source_ptr *)pjVar9;
    if (cinfo->progress != (jpeg_progress_mgr *)0x0) {
      piVar1 = (int *)((long)&cinfo->progress[1].progress_monitor + 4);
      *piVar1 = *piVar1 + 1;
    }
    sinfo->buffer_height = 1;
    pcVar10 = preload_image;
  }
  else {
    sinfo[1].finish_input = (_func_void_j_compress_ptr_cjpeg_source_ptr *)0x0;
    ppJVar11 = (*cinfo->mem->alloc_sarray)((j_common_ptr)cinfo,1,iVar17 * uVar12,1);
    sinfo->buffer = ppJVar11;
    sinfo->buffer_height = 1;
    pcVar10 = sinfo[2].finish_input;
  }
  uVar18 = (int)local_38 + (uint)local_52 * 0x100;
  sinfo->get_pixel_rows = pcVar10;
  if (local_58 != 0) {
    do {
      iVar6 = getc((FILE *)sinfo->input_file);
      if (iVar6 == -1) {
        puVar2 = *(undefined8 **)sinfo[1].start_input;
        *(undefined4 *)(puVar2 + 5) = 0x2b;
        (*(code *)*puVar2)();
      }
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
  }
  if (uVar18 == 0) {
    if (local_57 != 0) {
      pjVar8 = cinfo->err;
      pjVar8->msg_code = 0x40d;
      (*pjVar8->error_exit)((j_common_ptr)cinfo);
    }
    sinfo[1].get_pixel_rows = (_func_JDIMENSION_j_compress_ptr_cjpeg_source_ptr *)0x0;
    *(undefined4 *)&sinfo[2].start_input = 0;
  }
  else {
    if ((0x100 < uVar18) || (local_55 != 0)) {
      pjVar8 = cinfo->err;
      pjVar8->msg_code = 0x40c;
      (*pjVar8->error_exit)((j_common_ptr)cinfo);
    }
    ppJVar11 = (*cinfo->mem->alloc_sarray)((j_common_ptr)cinfo,1,uVar18,3);
    sinfo[1].get_pixel_rows = (_func_JDIMENSION_j_compress_ptr_cjpeg_source_ptr *)ppJVar11;
    *(uint *)&sinfo[2].start_input = uVar18;
    if (local_51 != '\x18') {
      puVar2 = *(undefined8 **)sinfo[1].start_input;
      *(undefined4 *)(puVar2 + 5) = 0x40c;
      (*(code *)*puVar2)();
    }
    uVar18 = (uint)local_52 * 0x100 + (int)local_38;
    uVar15 = 0;
    do {
      iVar6 = getc((FILE *)sinfo->input_file);
      if (iVar6 == -1) {
        puVar2 = *(undefined8 **)sinfo[1].start_input;
        *(undefined4 *)(puVar2 + 5) = 0x2b;
        (*(code *)*puVar2)();
      }
      *(char *)(*(long *)(sinfo[1].get_pixel_rows + 0x10) + uVar15) = (char)iVar6;
      iVar6 = getc((FILE *)sinfo->input_file);
      if (iVar6 == -1) {
        puVar2 = *(undefined8 **)sinfo[1].start_input;
        *(undefined4 *)(puVar2 + 5) = 0x2b;
        (*(code *)*puVar2)();
      }
      *(char *)(*(long *)(sinfo[1].get_pixel_rows + 8) + uVar15) = (char)iVar6;
      iVar6 = getc((FILE *)sinfo->input_file);
      if (iVar6 == -1) {
        puVar2 = *(undefined8 **)sinfo[1].start_input;
        *(undefined4 *)(puVar2 + 5) = 0x2b;
        (*(code *)*puVar2)();
      }
      *(char *)(*(long *)sinfo[1].get_pixel_rows + uVar15) = (char)iVar6;
      uVar15 = uVar15 + 1;
    } while (uVar18 != uVar15);
  }
  cinfo->input_components = iVar17;
  cinfo->data_precision = 8;
  cinfo->image_width = uVar12;
  cinfo->image_height = uVar13;
  return;
}

Assistant:

METHODDEF(void)
start_input_tga(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
{
  tga_source_ptr source = (tga_source_ptr)sinfo;
  U_CHAR targaheader[18];
  int idlen, cmaptype, subtype, flags, interlace_type, components;
  unsigned int width, height, maplen;
  boolean is_bottom_up;

#define GET_2B(offset) \
  ((unsigned int)UCH(targaheader[offset]) + \
   (((unsigned int)UCH(targaheader[offset + 1])) << 8))

  if (!ReadOK(source->pub.input_file, targaheader, 18))
    ERREXIT(cinfo, JERR_INPUT_EOF);

  /* Pretend "15-bit" pixels are 16-bit --- we ignore attribute bit anyway */
  if (targaheader[16] == 15)
    targaheader[16] = 16;

  idlen = UCH(targaheader[0]);
  cmaptype = UCH(targaheader[1]);
  subtype = UCH(targaheader[2]);
  maplen = GET_2B(5);
  width = GET_2B(12);
  height = GET_2B(14);
  source->pixel_size = UCH(targaheader[16]) >> 3;
  flags = UCH(targaheader[17]); /* Image Descriptor byte */

  is_bottom_up = ((flags & 0x20) == 0); /* bit 5 set => top-down */
  interlace_type = flags >> 6;  /* bits 6/7 are interlace code */

  if (cmaptype > 1 ||           /* cmaptype must be 0 or 1 */
      source->pixel_size < 1 || source->pixel_size > 4 ||
      (UCH(targaheader[16]) & 7) != 0 || /* bits/pixel must be multiple of 8 */
      interlace_type != 0 ||      /* currently don't allow interlaced image */
      width == 0 || height == 0)  /* image width/height must be non-zero */
    ERREXIT(cinfo, JERR_TGA_BADPARMS);
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
  if (sinfo->max_pixels &&
      (unsigned long long)width * height > sinfo->max_pixels)
    ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);
#endif

  if (subtype > 8) {
    /* It's an RLE-coded file */
    source->read_pixel = read_rle_pixel;
    source->block_count = source->dup_pixel_count = 0;
    subtype -= 8;
  } else {
    /* Non-RLE file */
    source->read_pixel = read_non_rle_pixel;
  }

  /* Now should have subtype 1, 2, or 3 */
  components = 3;               /* until proven different */
  cinfo->in_color_space = JCS_RGB;

  switch (subtype) {
  case 1:                       /* Colormapped image */
    if (source->pixel_size == 1 && cmaptype == 1)
      source->get_pixel_rows = get_8bit_row;
    else
      ERREXIT(cinfo, JERR_TGA_BADPARMS);
    TRACEMS2(cinfo, 1, JTRC_TGA_MAPPED, width, height);
    break;
  case 2:                       /* RGB image */
    switch (source->pixel_size) {
    case 2:
      source->get_pixel_rows = get_16bit_row;
      break;
    case 3:
      source->get_pixel_rows = get_24bit_row;
      break;
    case 4:
      source->get_pixel_rows = get_32bit_row;
      break;
    default:
      ERREXIT(cinfo, JERR_TGA_BADPARMS);
      break;
    }
    TRACEMS2(cinfo, 1, JTRC_TGA, width, height);
    break;
  case 3:                       /* Grayscale image */
    components = 1;
    cinfo->in_color_space = JCS_GRAYSCALE;
    if (source->pixel_size == 1)
      source->get_pixel_rows = get_8bit_gray_row;
    else
      ERREXIT(cinfo, JERR_TGA_BADPARMS);
    TRACEMS2(cinfo, 1, JTRC_TGA_GRAY, width, height);
    break;
  default:
    ERREXIT(cinfo, JERR_TGA_BADPARMS);
    break;
  }

  if (is_bottom_up) {
    /* Create a virtual array to buffer the upside-down image. */
    source->whole_image = (*cinfo->mem->request_virt_sarray)
      ((j_common_ptr)cinfo, JPOOL_IMAGE, FALSE,
       (JDIMENSION)width * components, (JDIMENSION)height, (JDIMENSION)1);
    if (cinfo->progress != NULL) {
      cd_progress_ptr progress = (cd_progress_ptr)cinfo->progress;
      progress->total_extra_passes++; /* count file input as separate pass */
    }
    /* source->pub.buffer will point to the virtual array. */
    source->pub.buffer_height = 1; /* in case anyone looks at it */
    source->pub.get_pixel_rows = preload_image;
  } else {
    /* Don't need a virtual array, but do need a one-row input buffer. */
    source->whole_image = NULL;
    source->pub.buffer = (*cinfo->mem->alloc_sarray)
      ((j_common_ptr)cinfo, JPOOL_IMAGE,
       (JDIMENSION)width * components, (JDIMENSION)1);
    source->pub.buffer_height = 1;
    source->pub.get_pixel_rows = source->get_pixel_rows;
  }

  while (idlen--)               /* Throw away ID field */
    (void)read_byte(source);

  if (maplen > 0) {
    if (maplen > 256 || GET_2B(3) != 0)
      ERREXIT(cinfo, JERR_TGA_BADCMAP);
    /* Allocate space to store the colormap */
    source->colormap = (*cinfo->mem->alloc_sarray)
      ((j_common_ptr)cinfo, JPOOL_IMAGE, (JDIMENSION)maplen, (JDIMENSION)3);
    source->cmap_length = (int)maplen;
    /* and read it from the file */
    read_colormap(source, (int)maplen, UCH(targaheader[7]));
  } else {
    if (cmaptype)               /* but you promised a cmap! */
      ERREXIT(cinfo, JERR_TGA_BADPARMS);
    source->colormap = NULL;
    source->cmap_length = 0;
  }

  cinfo->input_components = components;
  cinfo->data_precision = 8;
  cinfo->image_width = width;
  cinfo->image_height = height;
}